

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

void free_docio_object(docio_object *doc,uint8_t key_alloc,uint8_t meta_alloc,uint8_t body_alloc)

{
  if (doc != (docio_object *)0x0) {
    if (key_alloc != '\0') {
      free(doc->key);
      doc->key = (void *)0x0;
    }
    if (meta_alloc != '\0') {
      free(doc->meta);
      doc->meta = (void *)0x0;
    }
    if (body_alloc != '\0') {
      free(doc->body);
      doc->body = (void *)0x0;
    }
  }
  return;
}

Assistant:

void free_docio_object(struct docio_object *doc, uint8_t key_alloc,
                       uint8_t meta_alloc, uint8_t body_alloc) {
    if (!doc) {
        return;
    }

    if (key_alloc) {
        free(doc->key);
        doc->key = NULL;
    }
    if (meta_alloc) {
        free(doc->meta);
        doc->meta = NULL;
    }
    if (body_alloc) {
        free(doc->body);
        doc->body = NULL;
    }
}